

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_test.cc
# Opt level: O3

void __thiscall LexerReadVarValue::Run(LexerReadVarValue *this)

{
  Test *pTVar1;
  bool condition;
  int iVar2;
  string err;
  EvalString eval;
  Lexer lexer;
  string local_a8;
  string local_88;
  EvalString local_68;
  Lexer local_50;
  
  Lexer::Lexer(&local_50,"plain text $var $VaR ${x}\n");
  pTVar1 = g_current_test;
  local_68.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  condition = Lexer::ReadEvalString(&local_50,&local_68,false,&local_a8);
  testing::Test::Check
            (pTVar1,condition,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/lexer_test.cc"
             ,0x1a,"lexer.ReadVarValue(&eval, &err)");
  pTVar1 = g_current_test;
  iVar2 = std::__cxx11::string::compare((char *)&local_a8);
  testing::Test::Check
            (pTVar1,iVar2 == 0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/lexer_test.cc"
             ,0x1b,"\"\" == err");
  pTVar1 = g_current_test;
  EvalString::Serialize_abi_cxx11_(&local_88,&local_68);
  iVar2 = std::__cxx11::string::compare((char *)&local_88);
  testing::Test::Check
            (pTVar1,iVar2 == 0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/lexer_test.cc"
             ,0x1d,"\"[plain text ][$var][ ][$VaR][ ][$x]\" == eval.Serialize()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector(&local_68.parsed_);
  return;
}

Assistant:

TEST(Lexer, ReadVarValue) {
  Lexer lexer("plain text $var $VaR ${x}\n");
  EvalString eval;
  string err;
  EXPECT_TRUE(lexer.ReadVarValue(&eval, &err));
  EXPECT_EQ("", err);
  EXPECT_EQ("[plain text ][$var][ ][$VaR][ ][$x]",
            eval.Serialize());
}